

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CreateParallelValidator
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar3;
  SizeType i;
  ulong uVar4;
  long lVar5;
  
  if ((this->enum_ != (uint64_t *)0x0) || (context->arrayUniqueness == true)) {
    iVar2 = (*context->factory->_vptr_ISchemaStateFactory[4])();
    context->hasher = (void *)CONCAT44(extraout_var,iVar2);
  }
  if (this->validatorCount_ != 0) {
    if (context->validators != (ISchemaValidator **)0x0) {
      __assert_fail("context.validators == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                    ,0x5b9,
                    "bool rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>::CreateParallelValidator(Context &) const [SchemaDocumentType = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>]"
                   );
    }
    iVar2 = (*context->factory->_vptr_ISchemaStateFactory[7])();
    context->validators = (ISchemaValidator **)CONCAT44(extraout_var_00,iVar2);
    memset((ISchemaValidator **)CONCAT44(extraout_var_00,iVar2),0,(ulong)this->validatorCount_ << 3)
    ;
    context->validatorCount = this->validatorCount_;
    if ((this->allOf_).schemas != (SchemaType **)0x0) {
      CreateSchemaValidators(this,context,&this->allOf_,false);
    }
    if ((this->anyOf_).schemas != (SchemaType **)0x0) {
      CreateSchemaValidators(this,context,&this->anyOf_,false);
    }
    if ((this->oneOf_).schemas != (SchemaType **)0x0) {
      CreateSchemaValidators(this,context,&this->oneOf_,false);
    }
    if (this->not_ != (SchemaType *)0x0) {
      iVar2 = (*context->factory->_vptr_ISchemaStateFactory[2])(context->factory,this->not_,0);
      context->validators[this->notValidatorIndex_] =
           (ISchemaValidator *)CONCAT44(extraout_var_01,iVar2);
    }
    if (this->hasSchemaDependencies_ == true) {
      lVar5 = 0;
      for (uVar4 = 0; uVar4 < this->propertyCount_; uVar4 = uVar4 + 1) {
        lVar1 = *(long *)((long)&this->properties_->dependenciesSchema + lVar5);
        if (lVar1 != 0) {
          iVar2 = (*context->factory->_vptr_ISchemaStateFactory[2])(context->factory,lVar1,0);
          context->validators
          [*(uint *)((long)&this->properties_->dependenciesValidatorIndex + lVar5)] =
               (ISchemaValidator *)CONCAT44(extraout_var_02,iVar2);
        }
        lVar5 = lVar5 + 0x38;
      }
    }
  }
  if ((this->readOnly_ == true) && ((context->flags & 4) != 0)) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x28])();
    context->invalidCode = kValidateErrorReadOnly;
    this_00 = GetReadOnlyString();
  }
  else {
    if (this->writeOnly_ != true) {
      return true;
    }
    if ((context->flags & 2) == 0) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x29])();
    context->invalidCode = kValidateErrorWriteOnly;
    this_00 = GetWriteOnlyString();
  }
  pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar3;
  return false;
}

Assistant:

bool CreateParallelValidator(Context& context) const {
        if (enum_ || context.arrayUniqueness)
            context.hasher = context.factory.CreateHasher();

        if (validatorCount_) {
            RAPIDJSON_ASSERT(context.validators == 0);
            context.validators = static_cast<ISchemaValidator**>(context.factory.MallocState(sizeof(ISchemaValidator*) * validatorCount_));
            std::memset(context.validators, 0, sizeof(ISchemaValidator*) * validatorCount_);
            context.validatorCount = validatorCount_;

            // Always return after first failure for these sub-validators
            if (allOf_.schemas)
                CreateSchemaValidators(context, allOf_, false);

            if (anyOf_.schemas)
                CreateSchemaValidators(context, anyOf_, false);

            if (oneOf_.schemas)
                CreateSchemaValidators(context, oneOf_, false);

            if (not_)
                context.validators[notValidatorIndex_] = context.factory.CreateSchemaValidator(*not_, false);

            if (hasSchemaDependencies_) {
                for (SizeType i = 0; i < propertyCount_; i++)
                    if (properties_[i].dependenciesSchema)
                        context.validators[properties_[i].dependenciesValidatorIndex] = context.factory.CreateSchemaValidator(*properties_[i].dependenciesSchema, false);
            }
        }

        // Add any other type-independent checks here
        if (readOnly_ && (context.flags & kValidateWriteFlag)) {
            context.error_handler.DisallowedWhenWriting();
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorReadOnly);
        }
        if (writeOnly_ && (context.flags & kValidateReadFlag)) {
            context.error_handler.DisallowedWhenReading();
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorWriteOnly);
        }

        return true;
    }